

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightfield_tile_list_decoder.c
# Opt level: O0

int main(int argc,char **argv)

{
  aom_codec_err_t aVar1;
  long lVar2;
  aom_codec_iface_t *iface;
  char *pcVar3;
  aom_image_t *paVar4;
  undefined8 *in_RSI;
  int in_EDI;
  aom_image_t *img_1;
  aom_codec_iter_t iter_1;
  av1_ext_ref_frame_t set_ext_ref;
  FILE *ref_file;
  char name [1024];
  aom_image_t *img;
  aom_codec_iter_t iter;
  uint border;
  int frame_res [2];
  aom_img_fmt_t ref_fmt;
  aom_codec_ctx_t codec;
  aom_codec_iface_t *decoder;
  int n;
  int j;
  int i;
  int output_format;
  uchar *frame;
  size_t frame_size;
  aom_image_t reference_images [128];
  int num_tile_lists;
  int num_references;
  AvxVideoInfo *info;
  AvxVideoReader *reader;
  FILE *outfile;
  uint in_stack_ffffffffffffa718;
  int in_stack_ffffffffffffa71c;
  aom_codec_ctx_t *in_stack_ffffffffffffa720;
  aom_codec_iter_t *in_stack_ffffffffffffa728;
  aom_codec_ctx_t *in_stack_ffffffffffffa730;
  aom_codec_ctx_t *ctx;
  undefined4 in_stack_ffffffffffffa738;
  int iVar5;
  uint in_stack_ffffffffffffa73c;
  FILE *in_stack_ffffffffffffa740;
  uint in_stack_ffffffffffffa748;
  aom_img_fmt_t in_stack_ffffffffffffa74c;
  aom_image_t *in_stack_ffffffffffffa750;
  uint in_stack_ffffffffffffa760;
  FILE *in_stack_ffffffffffffa770;
  aom_image_t *in_stack_ffffffffffffa778;
  aom_codec_ctx_t *in_stack_ffffffffffffa780;
  int local_5458;
  int local_5454;
  uint local_5450;
  int local_544c;
  size_t local_5440;
  aom_codec_ctx_t local_5438 [384];
  int local_30;
  int local_2c;
  AvxVideoInfo *local_28;
  AvxVideoReader *local_20;
  FILE *local_18;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_18 = (FILE *)0x0;
  local_20 = (AvxVideoReader *)0x0;
  local_28 = (AvxVideoInfo *)0x0;
  local_5440 = 0;
  local_544c = 0;
  exec_name = (char *)*in_RSI;
  if (in_EDI < 5) {
    die("Invalid number of arguments.");
  }
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_20 = aom_video_reader_open
                       ((char *)CONCAT44(in_stack_ffffffffffffa73c,in_stack_ffffffffffffa738));
  if (local_20 == (AvxVideoReader *)0x0) {
    die("Failed to open %s for reading.",local_10[1]);
  }
  local_18 = fopen64((char *)local_10[2],"wb");
  if (local_18 == (FILE *)0x0) {
    die("Failed to open %s for writing.",local_10[2]);
  }
  lVar2 = strtol((char *)local_10[3],(char **)0x0,0);
  local_2c = (int)lVar2;
  lVar2 = strtol((char *)local_10[4],(char **)0x0,0);
  local_30 = (int)lVar2;
  if (5 < local_8) {
    lVar2 = strtol((char *)local_10[5],(char **)0x0,0);
    local_544c = (int)lVar2;
  }
  if ((-1 < local_544c) && (local_544c < 3)) {
    local_28 = aom_video_reader_get_info(local_20);
    iface = get_aom_decoder_by_fourcc((uint32_t)((ulong)in_stack_ffffffffffffa728 >> 0x20));
    if (iface == (aom_codec_iface_t *)0x0) {
      die("Unknown input codec.");
    }
    pcVar3 = aom_codec_iface_name(iface);
    printf("Using %s\n",pcVar3);
    aVar1 = aom_codec_dec_init_ver
                      ((aom_codec_ctx_t *)in_stack_ffffffffffffa740,
                       (aom_codec_iface_t *)
                       CONCAT44(in_stack_ffffffffffffa73c,in_stack_ffffffffffffa738),
                       (aom_codec_dec_cfg_t *)in_stack_ffffffffffffa730,
                       (aom_codec_flags_t)in_stack_ffffffffffffa728,
                       (int)((ulong)in_stack_ffffffffffffa720 >> 0x20));
    if (aVar1 != AOM_CODEC_OK) {
      die("Failed to initialize decoder.");
    }
    aVar1 = aom_codec_control_typechecked_AV1D_SET_IS_ANNEXB
                      (in_stack_ffffffffffffa720,in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718
                      );
    if (aVar1 != AOM_CODEC_OK) {
      die_codec(in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
    }
    aom_codec_control_typechecked_AV1_SET_TILE_MODE
              (in_stack_ffffffffffffa720,in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718);
    local_5450 = 0;
    do {
      if (local_2c <= (int)local_5450) {
        aom_codec_control_typechecked_AV1_SET_TILE_MODE
                  (in_stack_ffffffffffffa720,in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718);
        ctx = local_5438;
        iVar5 = local_2c;
        aom_codec_control_typechecked_AV1D_SET_EXT_REF_PTR
                  (in_stack_ffffffffffffa720,in_stack_ffffffffffffa71c,
                   (av1_ext_ref_frame_t *)0x116d89);
        aom_video_reader_read_frame
                  ((AvxVideoReader *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718));
        aom_video_reader_get_frame(local_20,&local_5440);
        aVar1 = aom_codec_decode((aom_codec_ctx_t *)in_stack_ffffffffffffa740,
                                 (uint8_t *)CONCAT44(in_stack_ffffffffffffa73c,iVar5),(size_t)ctx,
                                 in_stack_ffffffffffffa728);
        if (aVar1 != AOM_CODEC_OK) {
          die_codec(ctx,(char *)in_stack_ffffffffffffa728);
        }
        local_5458 = 0;
        while( true ) {
          if (local_30 <= local_5458) {
            for (local_5450 = 0; (int)local_5450 < local_2c; local_5450 = local_5450 + 1) {
              aom_img_free((aom_image_t *)0x116f56);
            }
            aVar1 = aom_codec_destroy((aom_codec_ctx_t *)
                                      CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718))
            ;
            if (aVar1 == AOM_CODEC_OK) {
              aom_video_reader_close((AvxVideoReader *)0x116f9c);
              fclose(local_18);
              return 0;
            }
            die_codec(ctx,(char *)in_stack_ffffffffffffa728);
          }
          aom_video_reader_read_frame
                    ((AvxVideoReader *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718)
                    );
          aom_video_reader_get_frame(local_20,&local_5440);
          aVar1 = aom_codec_decode((aom_codec_ctx_t *)in_stack_ffffffffffffa740,
                                   (uint8_t *)CONCAT44(in_stack_ffffffffffffa73c,iVar5),(size_t)ctx,
                                   in_stack_ffffffffffffa728);
          if (aVar1 != AOM_CODEC_OK) {
            die_codec(ctx,(char *)in_stack_ffffffffffffa728);
          }
          in_stack_ffffffffffffa728 = (aom_codec_iter_t *)0x0;
          paVar4 = aom_codec_get_frame(ctx,(aom_codec_iter_t *)0x0);
          if (paVar4 == (aom_image_t *)0x0) break;
          if (local_544c == 0) {
            write_tile_yuv1d(in_stack_ffffffffffffa780,in_stack_ffffffffffffa778,
                             in_stack_ffffffffffffa770);
          }
          else if (local_544c == 1) {
            aom_img_write((aom_image_t *)in_stack_ffffffffffffa740,
                          (FILE *)CONCAT44(in_stack_ffffffffffffa73c,iVar5));
          }
          else {
            aom_img_write_nv12(in_stack_ffffffffffffa750,
                               (FILE *)CONCAT44(in_stack_ffffffffffffa74c,in_stack_ffffffffffffa748)
                              );
          }
          local_5458 = local_5458 + 1;
        }
        die_codec(ctx,(char *)in_stack_ffffffffffffa728);
      }
      aom_video_reader_read_frame
                ((AvxVideoReader *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718));
      aom_video_reader_get_frame(local_20,&local_5440);
      aVar1 = aom_codec_decode((aom_codec_ctx_t *)in_stack_ffffffffffffa740,
                               (uint8_t *)
                               CONCAT44(in_stack_ffffffffffffa73c,in_stack_ffffffffffffa738),
                               (size_t)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728);
      if (aVar1 != AOM_CODEC_OK) {
        die_codec(in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
      }
      if (local_5450 == 0) {
        aVar1 = aom_codec_control_typechecked_AV1D_GET_IMG_FORMAT
                          (in_stack_ffffffffffffa720,in_stack_ffffffffffffa71c,
                           (aom_img_fmt_t *)0x116b3e);
        if (aVar1 != AOM_CODEC_OK) {
          die_codec(in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
        }
        aVar1 = aom_codec_control_typechecked_AV1D_GET_FRAME_SIZE
                          (in_stack_ffffffffffffa720,in_stack_ffffffffffffa71c,(int *)0x116b71);
        if (aVar1 != AOM_CODEC_OK) {
          die_codec(in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
        }
        for (local_5454 = 0; local_5454 < local_2c; local_5454 = local_5454 + 1) {
          in_stack_ffffffffffffa718 = 0x40;
          paVar4 = aom_img_alloc_with_border
                             (in_stack_ffffffffffffa750,in_stack_ffffffffffffa74c,
                              in_stack_ffffffffffffa748,
                              (uint)((ulong)in_stack_ffffffffffffa740 >> 0x20),
                              (uint)in_stack_ffffffffffffa740,in_stack_ffffffffffffa73c,
                              in_stack_ffffffffffffa760);
          if (paVar4 == (aom_image_t *)0x0) {
            fatal("Failed to allocate references.");
          }
        }
      }
      aVar1 = aom_codec_control_typechecked_AV1_COPY_NEW_FRAME_IMAGE
                        (in_stack_ffffffffffffa720,in_stack_ffffffffffffa71c,(aom_image_t *)0x116c58
                        );
      if (aVar1 != AOM_CODEC_OK) {
        die_codec(in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
      }
      while (paVar4 = aom_codec_get_frame(in_stack_ffffffffffffa730,in_stack_ffffffffffffa728),
            paVar4 != (aom_image_t *)0x0) {
        snprintf(&stack0xffffffffffffa748,0x400,"ref_%d.yuv",(ulong)local_5450);
        printf("writing ref image to %s, %u, %u\n",&stack0xffffffffffffa748,(ulong)paVar4->d_w,
               (ulong)paVar4->d_h);
        in_stack_ffffffffffffa740 = fopen64(&stack0xffffffffffffa748,"wb");
        aom_img_write((aom_image_t *)in_stack_ffffffffffffa740,
                      (FILE *)CONCAT44(in_stack_ffffffffffffa73c,in_stack_ffffffffffffa738));
        fclose(in_stack_ffffffffffffa740);
      }
      local_5450 = local_5450 + 1;
    } while( true );
  }
  die("Output format out of range [0, 2]");
}

Assistant:

int main(int argc, char **argv) {
  FILE *outfile = NULL;
  AvxVideoReader *reader = NULL;
  const AvxVideoInfo *info = NULL;
  int num_references;
  int num_tile_lists;
  aom_image_t reference_images[MAX_EXTERNAL_REFERENCES];
  size_t frame_size = 0;
  const unsigned char *frame = NULL;
  int output_format = YUV1D;
  int i, j, n;

  exec_name = argv[0];

  if (argc < 5) die("Invalid number of arguments.");

  reader = aom_video_reader_open(argv[1]);
  if (!reader) die("Failed to open %s for reading.", argv[1]);

  if (!(outfile = fopen(argv[2], "wb")))
    die("Failed to open %s for writing.", argv[2]);

  num_references = (int)strtol(argv[3], NULL, 0);
  num_tile_lists = (int)strtol(argv[4], NULL, 0);

  if (argc > 5) output_format = (int)strtol(argv[5], NULL, 0);
  if (output_format < YUV1D || output_format > NV12)
    die("Output format out of range [0, 2]");

  info = aom_video_reader_get_info(reader);

  aom_codec_iface_t *decoder = get_aom_decoder_by_fourcc(info->codec_fourcc);
  if (!decoder) die("Unknown input codec.");
  printf("Using %s\n", aom_codec_iface_name(decoder));

  aom_codec_ctx_t codec;
  if (aom_codec_dec_init(&codec, decoder, NULL, 0))
    die("Failed to initialize decoder.");

  if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_SET_IS_ANNEXB,
                                    info->is_annexb)) {
    die_codec(&codec, "Failed to set annex b status");
  }

  // Decode anchor frames.
  AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1_SET_TILE_MODE, 0);
  for (i = 0; i < num_references; ++i) {
    aom_video_reader_read_frame(reader);
    frame = aom_video_reader_get_frame(reader, &frame_size);
    if (aom_codec_decode(&codec, frame, frame_size, NULL))
      die_codec(&codec, "Failed to decode frame.");

    if (i == 0) {
      aom_img_fmt_t ref_fmt = 0;
      if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_GET_IMG_FORMAT, &ref_fmt))
        die_codec(&codec, "Failed to get the image format");

      int frame_res[2];
      if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_GET_FRAME_SIZE, frame_res))
        die_codec(&codec, "Failed to get the image frame size");

      // Allocate memory to store decoded references. Allocate memory with the
      // border so that it can be used as a reference.
      for (j = 0; j < num_references; j++) {
        unsigned int border = AOM_DEC_BORDER_IN_PIXELS;
        if (!aom_img_alloc_with_border(&reference_images[j], ref_fmt,
                                       frame_res[0], frame_res[1], 32, 8,
                                       border)) {
          fatal("Failed to allocate references.");
        }
      }
    }

    if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1_COPY_NEW_FRAME_IMAGE,
                                      &reference_images[i]))
      die_codec(&codec, "Failed to copy decoded reference frame");

    aom_codec_iter_t iter = NULL;
    aom_image_t *img = NULL;
    while ((img = aom_codec_get_frame(&codec, &iter)) != NULL) {
      char name[1024];
      snprintf(name, sizeof(name), "ref_%d.yuv", i);
      printf("writing ref image to %s, %u, %u\n", name, img->d_w, img->d_h);
      FILE *ref_file = fopen(name, "wb");
      aom_img_write(img, ref_file);
      fclose(ref_file);
    }
  }

  // Decode the lightfield.
  AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1_SET_TILE_MODE, 1);

  // Set external references.
  av1_ext_ref_frame_t set_ext_ref = { &reference_images[0], num_references };
  AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_SET_EXT_REF_PTR, &set_ext_ref);
  // Must decode the camera frame header first.
  aom_video_reader_read_frame(reader);
  frame = aom_video_reader_get_frame(reader, &frame_size);
  if (aom_codec_decode(&codec, frame, frame_size, NULL))
    die_codec(&codec, "Failed to decode the frame.");
  // Decode tile lists one by one.
  for (n = 0; n < num_tile_lists; n++) {
    aom_video_reader_read_frame(reader);
    frame = aom_video_reader_get_frame(reader, &frame_size);

    if (aom_codec_decode(&codec, frame, frame_size, NULL))
      die_codec(&codec, "Failed to decode the tile list.");
    aom_codec_iter_t iter = NULL;
    aom_image_t *img = aom_codec_get_frame(&codec, &iter);
    if (!img) die_codec(&codec, "Failed to get frame.");

    if (output_format == YUV1D)
      // write the tile to the output file in 1D format.
      write_tile_yuv1d(&codec, img, outfile);
    else if (output_format == YUV)
      aom_img_write(img, outfile);
    else
      // NV12 output format
      aom_img_write_nv12(img, outfile);
  }

  for (i = 0; i < num_references; i++) aom_img_free(&reference_images[i]);
  if (aom_codec_destroy(&codec)) die_codec(&codec, "Failed to destroy codec");
  aom_video_reader_close(reader);
  fclose(outfile);

  return EXIT_SUCCESS;
}